

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int set_parameters_from_string(char **file_content,char *name)

{
  uint uVar1;
  uint uVar2;
  int (*paaiVar3) [5] [5];
  int iVar4;
  parset pVar5;
  size_t sVar6;
  int *piVar7;
  int (*paaiVar8) [5] [5];
  int (*paiVar9) [5];
  int (*array) [8] [5] [5] [5];
  int (*paaaiVar10) [8] [5] [5];
  int m_1;
  int (*paaaiVar11) [8] [5] [5];
  int *in_R8;
  int *in_R9;
  int m;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  int (*paaaaaiVar18) [8] [5] [5] [5] [5];
  int n;
  int (*paiVar19) [8];
  ulong uVar20;
  int n_1;
  int (*paiVar21) [8];
  ulong uVar22;
  int (*paaaaaiVar23) [8] [5] [5] [5] [5];
  int values [6];
  char ident [256];
  int *local_1b8;
  int (*local_1b0) [5];
  int (*local_1a8) [5] [5];
  int (*local_1a0) [5] [5];
  undefined8 local_198;
  undefined8 uStack_190;
  int local_188;
  int local_184;
  int (*local_180) [5] [5];
  int (*local_178) [5];
  int (*local_170) [5];
  int (*local_168) [5] [5];
  int (*local_160) [5];
  int (*local_158) [5] [5];
  int (*local_150) [5] [5];
  int (*local_148) [5] [5];
  long local_140;
  char local_138 [264];
  
  local_1b8 = (int *)0x0;
  iVar4 = 0;
  if ((file_content != (char **)0x0) && (iVar4 = 0, *file_content != (char *)0x0)) {
    free(last_param_file);
    if (name == (char *)0x0) {
      last_param_file = (char *)0x0;
    }
    else {
      last_param_file = strdup(name);
    }
    local_1b8 = (int *)0x1;
    iVar4 = strncmp(*file_content,"## RNAfold parameter file v2.0",0x1e);
    if (iVar4 != 0) {
      vrna_message_warning
                (
                "Missing header line in file.\nMay be this file has not v2.0 format.\nUse INTERRUPT-key to stop."
                );
    }
    pcVar15 = file_content[(long)local_1b8];
    paaiVar3 = (int (*) [5] [5])file_content;
    paaiVar8 = local_1a0;
    while (local_1a0 = paaiVar3, piVar7 = (int *)((long)local_1b8 + 1), local_1b8 = piVar7,
          pcVar15 != (char *)0x0) {
      iVar4 = __isoc99_sscanf(pcVar15,"# %255s",local_138);
      if (iVar4 != 1) goto switchD_001259b3_caseD_0;
      pVar5 = gettype(local_138);
      switch(pVar5) {
      case QUIT:
        goto switchD_001259b3_caseD_0;
      case S:
        paiVar9 = (int (*) [5])stack37;
        goto LAB_001259dd;
      case S_H:
        paiVar9 = (int (*) [5])stackdH;
LAB_001259dd:
        piVar7 = stack_dim;
        in_R8 = stack_shift;
        goto LAB_00125c30;
      case HP:
        piVar7 = hairpin37;
        goto LAB_00125a24;
      case HP_H:
        piVar7 = hairpindH;
        goto LAB_00125a24;
      case B:
        piVar7 = bulge37;
        goto LAB_00125a24;
      case B_H:
        piVar7 = bulgedH;
        goto LAB_00125a24;
      case IL:
        piVar7 = internal_loop37;
        goto LAB_00125a24;
      case IL_H:
        piVar7 = internal_loopdH;
LAB_00125a24:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,(size_t *)&local_1b8,piVar7,0x1f,0,0);
        goto switchD_001259b3_caseD_0;
      case MMH:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchH37;
        break;
      case MMH_H:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchHdH;
        break;
      case MMI:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchI37;
        break;
      case MMI_H:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchIdH;
        break;
      case MMI1N:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatch1nI37;
        break;
      case MMI1N_H:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatch1nIdH;
        break;
      case MMI23:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatch23I37;
        break;
      case MMI23_H:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatch23IdH;
        break;
      case MMM:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchM37;
        break;
      case MMM_H:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchMdH;
        break;
      case MME:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchExt37;
        break;
      case MME_H:
        uStack_190 = (ulong)uStack_190._4_4_ << 0x20;
        paaiVar8 = mismatchExtdH;
        break;
      case D5:
        paiVar9 = dangle5_37;
        goto LAB_00125c22;
      case D5_H:
        paiVar9 = dangle5_dH;
        goto LAB_00125c22;
      case D3:
        paiVar9 = dangle3_37;
        goto LAB_00125c22;
      case D3_H:
        paiVar9 = dangle3_dH;
LAB_00125c22:
        piVar7 = dangle_dim;
        in_R8 = dangle_shift;
LAB_00125c30:
        local_198 = 0;
        in_R9 = (int *)&local_198;
        rd_2dim_slice(file_content,(size_t *)&local_1b8,*paiVar9,piVar7,in_R8,in_R9);
        goto switchD_001259b3_caseD_0;
      case INT11:
        paaaiVar10 = int11_37;
        goto LAB_00125c6a;
      case INT11_H:
        paaaiVar10 = int11_dH;
LAB_00125c6a:
        uStack_190 = 0;
        local_198 = 0;
        in_R9 = (int *)&local_198;
        in_R8 = int11_shift;
        rd_4dim_slice(file_content,(size_t *)&local_1b8,(int *)paaaiVar10,int11_dim,int11_shift,
                      in_R9);
        goto switchD_001259b3_caseD_0;
      case INT21:
        array = int21_37;
        goto LAB_00125cc2;
      case INT21_H:
        array = int21_dH;
LAB_00125cc2:
        local_188 = 0;
        uStack_190 = 0;
        local_198 = 0;
        in_R9 = (int *)&local_198;
        in_R8 = int21_shift;
        rd_5dim_slice(file_content,(size_t *)&local_1b8,(int *)array,int21_dim,int21_shift,in_R9);
        goto switchD_001259b3_caseD_0;
      case INT22:
        paaaaaiVar18 = int22_37;
        goto LAB_00125cf2;
      case INT22_H:
        paaaaaiVar18 = int22_dH;
LAB_00125cf2:
        rd_6dim_slice(file_content,(size_t *)&local_1b8,(int *)paaaaaiVar18,piVar7,in_R8,in_R9);
        update_nst(paaaaaiVar18);
        goto switchD_001259b3_caseD_0;
      case ML:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,(size_t *)&local_1b8,(int *)&local_198,6,0,0);
        ML_BASE37 = (int)local_198;
        ML_BASEdH = local_198._4_4_;
        ML_closing37 = (int)uStack_190;
        ML_closingdH = uStack_190._4_4_;
        ML_intern37 = local_188;
        piVar7 = &ML_interndH;
        iVar4 = local_184;
        goto LAB_00126086;
      case TL:
        pcVar15 = Tetraloops;
        memset(Tetraloops,0,0x119);
        piVar7 = Tetraloop37;
        memset(Tetraloop37,0,0xa0);
        piVar12 = TetraloopdH;
        memset(TetraloopdH,0,0xa0);
        local_1a8 = (int (*) [5] [5])local_1b8;
        local_1b0 = (int (*) [5])(file_content + (long)local_1b8);
        uVar20 = 0;
        do {
          uVar22 = uVar20;
          if (*(char **)((long)local_1b0 + uVar22 * 8) == (char *)0x0) break;
          in_R8 = piVar12;
          iVar4 = __isoc99_sscanf(*(char **)((long)local_1b0 + uVar22 * 8),"%6s %d %d",pcVar15,
                                  piVar7);
          sVar6 = strlen(Tetraloops);
          (Tetraloops + sVar6)[0] = ' ';
          (Tetraloops + sVar6)[1] = '\0';
          if (iVar4 != 3) break;
          piVar12 = piVar12 + 1;
          piVar7 = piVar7 + 1;
          pcVar15 = pcVar15 + 7;
          uVar20 = uVar22 + 1;
        } while (uVar22 < 0x27);
        goto LAB_00125fb8;
      case TRI:
        pcVar15 = Triloops;
        memset(Triloops,0,0xf1);
        piVar7 = Triloop37;
        memset(Triloop37,0,0xa0);
        piVar12 = TriloopdH;
        memset(TriloopdH,0,0xa0);
        local_1a8 = (int (*) [5] [5])local_1b8;
        local_1b0 = (int (*) [5])(file_content + (long)local_1b8);
        uVar20 = 0;
        do {
          uVar22 = uVar20;
          if (*(char **)((long)local_1b0 + uVar22 * 8) == (char *)0x0) break;
          in_R8 = piVar12;
          iVar4 = __isoc99_sscanf(*(char **)((long)local_1b0 + uVar22 * 8),"%5s %d %d",pcVar15,
                                  piVar7);
          sVar6 = strlen(Triloops);
          (Triloops + sVar6)[0] = ' ';
          (Triloops + sVar6)[1] = '\0';
          if (iVar4 != 3) break;
          piVar12 = piVar12 + 1;
          piVar7 = piVar7 + 1;
          pcVar15 = pcVar15 + 6;
          uVar20 = uVar22 + 1;
        } while (uVar22 < 0x27);
        goto LAB_00125fb8;
      case HEX:
        pcVar15 = Hexaloops;
        memset(Hexaloops,0,0x169);
        piVar7 = Hexaloop37;
        memset(Hexaloop37,0,0xa0);
        piVar12 = HexaloopdH;
        memset(HexaloopdH,0,0xa0);
        local_1a8 = (int (*) [5] [5])local_1b8;
        local_1b0 = (int (*) [5])(file_content + (long)local_1b8);
        uVar20 = 0;
        do {
          uVar22 = uVar20;
          if (*(char **)((long)local_1b0 + uVar22 * 8) == (char *)0x0) break;
          in_R8 = piVar12;
          iVar4 = __isoc99_sscanf(*(char **)((long)local_1b0 + uVar22 * 8),"%8s %d %d",pcVar15,
                                  piVar7);
          sVar6 = strlen(Hexaloops);
          (Hexaloops + sVar6)[0] = ' ';
          (Hexaloops + sVar6)[1] = '\0';
          if (iVar4 != 3) break;
          piVar12 = piVar12 + 1;
          piVar7 = piVar7 + 1;
          pcVar15 = pcVar15 + 9;
          uVar20 = uVar22 + 1;
        } while (uVar22 < 0x27);
LAB_00125fb8:
        local_1b8 = (int *)((long)local_1a8 + uVar22 + 1);
        file_content = (char **)local_1a0;
        goto switchD_001259b3_caseD_0;
      case NIN:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,(size_t *)&local_1b8,(int *)&local_198,3,0,0);
        ninio37 = (int)local_198;
        niniodH = local_198._4_4_;
        piVar7 = &MAX_NINIO;
        iVar4 = (int)uStack_190;
        goto LAB_00126086;
      case MISC:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,(size_t *)&local_1b8,(int *)&local_198,4,0,0);
        DuplexInit37 = (int)local_198;
        DuplexInitdH = local_198._4_4_;
        TerminalAU37 = (int)uStack_190;
        piVar7 = &TerminalAUdH;
        iVar4 = uStack_190._4_4_;
LAB_00126086:
        *piVar7 = iVar4;
        goto switchD_001259b3_caseD_0;
      default:
        vrna_message_warning("read_epars: Unknown field identifier in `%s\'",pcVar15);
        goto switchD_001259b3_caseD_0;
      }
      local_198 = 0;
      in_R9 = (int *)&local_198;
      in_R8 = mismatch_shift;
      rd_3dim_slice(file_content,(size_t *)&local_1b8,(int *)paaiVar8,mismatch_dim,mismatch_shift,
                    in_R9);
switchD_001259b3_caseD_0:
      paaiVar3 = local_1a0;
      paaiVar8 = local_1a0;
      pcVar15 = file_content[(long)local_1b8];
    }
    paiVar19 = stack37;
    paiVar21 = stack37;
    lVar13 = 0;
    local_1a0 = paaiVar8;
    do {
      lVar16 = 0;
      do {
        if (*(int *)((long)*paiVar19 + lVar16) != *(int *)((long)paiVar21 + lVar16 * 2 * 4)) {
          vrna_message_warning("stacking energies not symmetric");
        }
        lVar16 = lVar16 + 4;
      } while (lVar16 != 0x20);
      lVar13 = lVar13 + 1;
      paiVar21 = (int (*) [8])((long)paiVar21 + 4);
      paiVar19 = paiVar19 + 1;
    } while (lVar13 != 8);
    paiVar19 = stackdH;
    paiVar21 = stackdH;
    lVar13 = 0;
    do {
      lVar16 = 0;
      do {
        if (*(int *)((long)*paiVar19 + lVar16) != *(int *)((long)paiVar21 + lVar16 * 2 * 4)) {
          vrna_message_warning("stacking enthalpies not symmetric");
        }
        lVar16 = lVar16 + 4;
      } while (lVar16 != 0x20);
      lVar13 = lVar13 + 1;
      paiVar21 = (int (*) [8])((long)paiVar21 + 4);
      paiVar19 = paiVar19 + 1;
    } while (lVar13 != 8);
    paaaiVar11 = int11_37;
    paaaiVar10 = int11_37;
    uVar20 = 0;
    do {
      uVar22 = 0;
      local_180 = *paaaiVar10;
      local_178 = (int (*) [5])paaaiVar11;
      do {
        uVar14 = 0;
        local_1a8 = *paaaiVar10;
        local_1a0 = *paaaiVar11;
        do {
          uVar17 = 0;
          local_1b0 = (int (*) [5])paaaiVar10;
          do {
            uVar1 = (*(int (*) [5] [5])*(int (*) [5])paaaiVar11)[0][uVar17];
            uVar2 = (*(int (*) [5] [5])*(int (*) [5])paaaiVar10)[0][0];
            if (uVar1 != uVar2) {
              vrna_message_warning
                        ("int11 energies not symmetric (%d,%d,%d,%d) (%d vs. %d)",
                         uVar20 & 0xffffffff,uVar22 & 0xffffffff,uVar14 & 0xffffffff,
                         uVar17 & 0xffffffff,(ulong)uVar1,uVar2);
            }
            uVar17 = uVar17 + 1;
            paaaiVar10 = (int (*) [8] [5] [5])((long)paaaiVar10 + 0x14);
          } while (uVar17 != 5);
          uVar14 = uVar14 + 1;
          paaaiVar10 = (int (*) [8] [5] [5])(*local_1b0 + 1);
          paaaiVar11 = (int (*) [8] [5] [5])((long)paaaiVar11 + 0x14);
        } while (uVar14 != 5);
        uVar22 = uVar22 + 1;
        paaaiVar10 = (int (*) [8] [5] [5])((long)local_1a8 + 800);
        paaaiVar11 = (int (*) [8] [5] [5])((long)local_1a0 + 100);
      } while (uVar22 != 8);
      uVar20 = uVar20 + 1;
      paaaiVar10 = (int (*) [8] [5] [5])((long)local_180 + 100);
      paaaiVar11 = (int (*) [8] [5] [5])(local_178 + 0x28);
    } while (uVar20 != 8);
    paaaiVar10 = int11_dH;
    paaaiVar11 = int11_dH;
    local_170 = (int (*) [5])0x0;
    do {
      local_1a8 = (int (*) [5] [5])0x0;
      local_180 = *paaaiVar11;
      local_178 = (int (*) [5])paaaiVar10;
      do {
        lVar13 = 0;
        local_1b0 = (int (*) [5])paaaiVar10;
        local_1a0 = *paaaiVar11;
        do {
          lVar16 = 0;
          paiVar9 = (int (*) [5])paaaiVar11;
          do {
            if ((*(int (*) [5] [5])*(int (*) [5])paaaiVar10)[0][lVar16] !=
                (*(int (*) [5] [5])*paiVar9)[0][0]) {
              vrna_message_warning("int11 enthalpies not symmetric");
            }
            lVar16 = lVar16 + 1;
            paiVar9 = paiVar9 + 1;
          } while (lVar16 != 5);
          lVar13 = lVar13 + 1;
          paaaiVar11 = (int (*) [8] [5] [5])(*(int (*) [5])paaaiVar11 + 1);
          paaaiVar10 = (int (*) [8] [5] [5])((long)paaaiVar10 + 0x14);
        } while (lVar13 != 5);
        local_1a8 = (int (*) [5] [5])((long)local_1a8 + 1);
        paaaiVar11 = (int (*) [8] [5] [5])((long)local_1a0 + 800);
        paaaiVar10 = (int (*) [8] [5] [5])(local_1b0 + 5);
      } while (local_1a8 != (int (*) [5] [5])0x8);
      local_170 = (int (*) [5])((long)local_170 + 1);
      paaaiVar11 = (int (*) [8] [5] [5])((long)local_180 + 100);
      paaaiVar10 = (int (*) [8] [5] [5])(local_178 + 0x28);
    } while (local_170 != (int (*) [5])0x8);
    paaaaaiVar18 = int22_37;
    paaaaaiVar23 = int22_37;
    lVar13 = 0;
    do {
      local_158 = (int (*) [5] [5])0x0;
      local_168 = (int (*) [5] [5])paaaaaiVar23;
      local_160 = (int (*) [5])paaaaaiVar18;
      local_140 = lVar13;
      do {
        local_170 = (int (*) [5])0x0;
        local_150 = (int (*) [5] [5])paaaaaiVar23;
        local_148 = (int (*) [5] [5])paaaaaiVar18;
        do {
          local_1a8 = (int (*) [5] [5])0x0;
          local_180 = (int (*) [5] [5])paaaaaiVar23;
          local_178 = (int (*) [5])paaaaaiVar18;
          do {
            lVar13 = 0;
            local_1b0 = (int (*) [5])paaaaaiVar18;
            local_1a0 = (int (*) [5] [5])paaaaaiVar23;
            do {
              lVar16 = 0;
              paaiVar8 = (int (*) [5] [5])paaaaaiVar23;
              do {
                if ((*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaaiVar18)[0][0][0][lVar16] !=
                    (*(int (*) [5] [5] [5] [5])*paaiVar8)[0][0][0][0]) {
                  vrna_message_warning("int22 energies not symmetric");
                }
                lVar16 = lVar16 + 1;
                paaiVar8 = paaiVar8 + 1;
              } while (lVar16 != 5);
              lVar13 = lVar13 + 1;
              paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar23 + 500);
              paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar18 + 0x14);
            } while (lVar13 != 5);
            local_1a8 = (int (*) [5] [5])((long)local_1a8 + 1);
            paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])((*local_1a0)[0] + 1);
            paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])(local_1b0 + 5);
          } while (local_1a8 != (int (*) [5] [5])0x5);
          local_170 = (int (*) [5])((long)local_170 + 1);
          paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(*local_180 + 1);
          paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])(local_178 + 0x19);
        } while (local_170 != (int (*) [5])0x5);
        local_158 = (int (*) [5] [5])((long)local_158 + 1);
        paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(local_150 + 200);
        paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])((long)local_148 + 0x9c4);
      } while (local_158 != (int (*) [5] [5])0x8);
      lVar13 = local_140 + 1;
      paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(local_168 + 0x19);
      paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])(local_160 + 1000);
    } while (lVar13 != 8);
    paaaaaiVar18 = int22_dH;
    paaaaaiVar23 = int22_dH;
    local_1a0 = (int (*) [5] [5])0x0;
    do {
      local_1b0 = (int (*) [5])0x0;
      local_168 = (int (*) [5] [5])paaaaaiVar23;
      local_160 = (int (*) [5])paaaaaiVar18;
      do {
        uVar20 = 0;
        local_158 = (int (*) [5] [5])paaaaaiVar23;
        local_150 = (int (*) [5] [5])paaaaaiVar18;
        do {
          uVar22 = 0;
          local_170 = (int (*) [5])paaaaaiVar18;
          local_148 = (int (*) [5] [5])paaaaaiVar23;
          do {
            uVar14 = 0;
            local_180 = (int (*) [5] [5])paaaaaiVar23;
            local_178 = (int (*) [5])paaaaaiVar18;
            do {
              lVar13 = 0;
              local_1a8 = (int (*) [5] [5])paaaaaiVar23;
              do {
                if ((*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaaiVar18)[0][0][0][lVar13] !=
                    (*(int (*) [5] [5] [5] [5])*(int (*) [5] [5])paaaaaiVar23)[0][0][0][0]) {
                  vrna_message_warning
                            ("int22 enthalpies not symmetric: %d %d %d %d %d %d",local_1a0,local_1b0
                             ,uVar20 & 0xffffffff,uVar22 & 0xffffffff,uVar14 & 0xffffffff,
                             (int)lVar13);
                }
                lVar13 = lVar13 + 1;
                paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar23 + 100);
              } while (lVar13 != 5);
              uVar14 = uVar14 + 1;
              paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(local_1a8 + 5);
              paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar18 + 0x14);
            } while (uVar14 != 5);
            uVar22 = uVar22 + 1;
            paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])((*local_180)[0] + 1);
            paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])(local_178 + 5);
          } while (uVar22 != 5);
          uVar20 = uVar20 + 1;
          paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(*local_148 + 1);
          paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])(local_170 + 0x19);
        } while (uVar20 != 5);
        local_1b0 = (int (*) [5])((long)local_1b0 + 1);
        paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(local_158 + 200);
        paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])((long)local_150 + 0x9c4);
      } while (local_1b0 != (int (*) [5])0x8);
      local_1a0 = (int (*) [5] [5])((long)local_1a0 + 1);
      paaaaaiVar23 = (int (*) [8] [5] [5] [5] [5])(local_168 + 0x19);
      paaaaaiVar18 = (int (*) [8] [5] [5] [5] [5])(local_160 + 1000);
    } while (local_1a0 != (int (*) [5] [5])0x8);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

PRIVATE int
set_parameters_from_string(char       **file_content,
                           const char *name)
{
  size_t      line_no;
  char        *line, ident[256];
  enum parset type;
  int         r;

  line_no = 0;

  if ((!file_content) ||
      (!file_content[line_no]))
    return 0;

  /* store file name of parameter data set */
  free(last_param_file);
  last_param_file = (name) ? strdup(name) : NULL;
  // free(last_param_file);

  if (strncmp(file_content[line_no++], "## RNAfold parameter file v2.0", 30) != 0) {
    vrna_message_warning("Missing header line in file.\n"
                         "May be this file has not v2.0 format.\n"
                         "Use INTERRUPT-key to stop.");
  }

  while ((line = file_content[line_no++])) {
    r = sscanf(line, "# %255s", ident);
    if (r == 1) {
      type = gettype(ident);
      switch (type) {
        case QUIT:
          break;
        case S:
          rd_2dim(file_content, &line_no, &(stack37[0][0]), stack_dim, stack_shift);
          break;
        case S_H:
          rd_2dim(file_content, &line_no, &(stackdH[0][0]), stack_dim, stack_shift);
          break;
        case HP:
          rd_1dim(file_content, &line_no, &(hairpin37[0]), 31, 0);
          break;
        case HP_H:
          rd_1dim(file_content, &line_no, &(hairpindH[0]), 31, 0);
          break;
        case B:
          rd_1dim(file_content, &line_no, &(bulge37[0]), 31, 0);
          break;
        case B_H:
          rd_1dim(file_content, &line_no, &(bulgedH[0]), 31, 0);
          break;
        case IL:
          rd_1dim(file_content, &line_no, &(internal_loop37[0]), 31, 0);
          break;
        case IL_H:
          rd_1dim(file_content, &line_no, &(internal_loopdH[0]), 31, 0);
          break;
        case MME:
          rd_3dim(file_content, &line_no, &(mismatchExt37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MME_H:
          rd_3dim(file_content, &line_no, &(mismatchExtdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH:
          rd_3dim(file_content, &line_no, &(mismatchH37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH_H:
          rd_3dim(file_content, &line_no, &(mismatchHdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI:
          rd_3dim(file_content, &line_no, &(mismatchI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI_H:
          rd_3dim(file_content, &line_no, &(mismatchIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N:
          rd_3dim(file_content, &line_no, &(mismatch1nI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N_H:
          rd_3dim(file_content, &line_no, &(mismatch1nIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23:
          rd_3dim(file_content, &line_no, &(mismatch23I37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23_H:
          rd_3dim(file_content, &line_no, &(mismatch23IdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM:
          rd_3dim(file_content, &line_no, &(mismatchM37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM_H:
          rd_3dim(file_content, &line_no, &(mismatchMdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case INT11:
          rd_4dim(file_content, &line_no, &(int11_37[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT11_H:
          rd_4dim(file_content, &line_no, &(int11_dH[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT21:
          rd_5dim(file_content, &line_no, &(int21_37[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT21_H:
          rd_5dim(file_content, &line_no, &(int21_dH[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT22:
          rd_6dim_slice(file_content, &line_no, &(int22_37[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_37);
          break;
        case INT22_H:
          rd_6dim_slice(file_content, &line_no, &(int22_dH[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_dH);
          break;
        case D5:
          rd_2dim(file_content, &line_no, &(dangle5_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D5_H:
          rd_2dim(file_content, &line_no, &(dangle5_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3:
          rd_2dim(file_content, &line_no, &(dangle3_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3_H:
          rd_2dim(file_content, &line_no, &(dangle3_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case ML:
        {
          int values[6];
          rd_1dim(file_content, &line_no, &values[0], 6, 0);
          ML_BASE37     = values[0];
          ML_BASEdH     = values[1];
          ML_closing37  = values[2];
          ML_closingdH  = values[3];
          ML_intern37   = values[4];
          ML_interndH   = values[5];
        }
        break;
        case NIN:
        {
          int values[3];
          rd_1dim(file_content, &line_no, &values[0], 3, 0);
          ninio37   = values[0];
          niniodH   = values[1];
          MAX_NINIO = values[2];
        }
        break;
        case MISC:
        {
          int values[4];
          rd_1dim(file_content, &line_no, &values[0], 4, 0);
          DuplexInit37  = values[0];
          DuplexInitdH  = values[1];
          TerminalAU37  = values[2];
          TerminalAUdH  = values[3];
        }
        break;
        case TL:
          rd_Tetraloop37(file_content, &line_no);
          break;
        case TRI:
          rd_Triloop37(file_content, &line_no);
          break;
        case HEX:
          rd_Hexaloop37(file_content, &line_no);
          break;
        default:      /* do nothing but complain */
          vrna_message_warning("read_epars: Unknown field identifier in `%s'", line);
      }
    } /* else ignore line */
  }

  check_symmetry();
  return 1;
}